

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectgenerator.cpp
# Opt level: O0

bool __thiscall ProjectGenerator::addFile(ProjectGenerator *this,QString *file)

{
  bool bVar1;
  byte bVar2;
  qsizetype qVar3;
  ProStringList *this_00;
  reference pQVar4;
  ulong uVar5;
  const_reference pQVar6;
  QString *in_RSI;
  long in_FS_OFFSET;
  ProStringList *endList;
  int cit;
  int hit;
  int cppit;
  int s;
  QString newfile;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_0000020c;
  ProKey where;
  QString dir;
  undefined4 in_stack_fffffffffffffca8;
  FileFixifyType in_stack_fffffffffffffcac;
  undefined4 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb4;
  byte in_stack_fffffffffffffcb5;
  byte in_stack_fffffffffffffcb6;
  byte in_stack_fffffffffffffcb7;
  QString *in_stack_fffffffffffffcb8;
  CaseSensitivity cs;
  ProjectGenerator *in_stack_fffffffffffffcc0;
  QString *in_stack_fffffffffffffcc8;
  int local_304;
  int local_300;
  int local_2fc;
  bool local_2d9;
  undefined1 in_stack_fffffffffffffd57;
  QString *in_stack_fffffffffffffd58;
  MakefileGenerator *in_stack_fffffffffffffd60;
  undefined1 local_238 [72];
  undefined1 local_1f0 [24];
  undefined1 local_1d8 [312];
  ProString local_a0;
  undefined1 local_70 [48];
  QString local_40 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QFlags<MakefileGenerator::FileFixifyType>::QFlags
            ((QFlags<MakefileGenerator::FileFixifyType> *)
             CONCAT17(in_stack_fffffffffffffcb7,
                      CONCAT16(in_stack_fffffffffffffcb6,
                               CONCAT15(in_stack_fffffffffffffcb5,
                                        CONCAT14(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0
                                                )))),in_stack_fffffffffffffcac);
  MakefileGenerator::fileFixify
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (FileFixifyTypes)in_stack_0000020c.i,(bool)in_stack_fffffffffffffd57);
  QString::operator=((QString *)
                     CONCAT17(in_stack_fffffffffffffcb7,
                              CONCAT16(in_stack_fffffffffffffcb6,
                                       CONCAT15(in_stack_fffffffffffffcb5,
                                                CONCAT14(in_stack_fffffffffffffcb4,
                                                         in_stack_fffffffffffffcb0)))),
                     (QString *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  QString::~QString((QString *)0x1e718a);
  local_40[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_40[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_40[0].d.size = -0x5555555555555556;
  QString::QString((QString *)0x1e71c4);
  qVar3 = QString::lastIndexOf
                    ((QString *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                     CONCAT13(in_stack_fffffffffffffcb7,
                              CONCAT12(in_stack_fffffffffffffcb6,
                                       CONCAT11(in_stack_fffffffffffffcb5,in_stack_fffffffffffffcb4)
                                      )));
  if ((int)qVar3 != -1) {
    QString::left(in_stack_fffffffffffffcc8,(qsizetype)in_stack_fffffffffffffcc0);
    QString::operator=((QString *)
                       CONCAT17(in_stack_fffffffffffffcb7,
                                CONCAT16(in_stack_fffffffffffffcb6,
                                         CONCAT15(in_stack_fffffffffffffcb5,
                                                  CONCAT14(in_stack_fffffffffffffcb4,
                                                           in_stack_fffffffffffffcb0)))),
                       (QString *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    QString::~QString((QString *)0x1e7223);
  }
  QString::size(local_40);
  QString::size(&Option::h_moc_mod);
  QString::mid((longlong)local_70,(longlong)in_RSI);
  bVar1 = ::operator==((QString *)
                       CONCAT17(in_stack_fffffffffffffcb7,
                                CONCAT16(in_stack_fffffffffffffcb6,
                                         CONCAT15(in_stack_fffffffffffffcb5,
                                                  CONCAT14(in_stack_fffffffffffffcb4,
                                                           in_stack_fffffffffffffcb0)))),
                       (QString *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  QString::~QString((QString *)0x1e7280);
  if (bVar1) {
    local_2d9 = false;
  }
  else {
    memset(&local_a0,0xaa,0x30);
    ProString::ProString
              ((ProString *)
               CONCAT17(in_stack_fffffffffffffcb7,
                        CONCAT16(in_stack_fffffffffffffcb6,
                                 CONCAT15(in_stack_fffffffffffffcb5,
                                          CONCAT14(in_stack_fffffffffffffcb4,
                                                   in_stack_fffffffffffffcb0)))));
    local_2fc = 0;
    while( true ) {
      this_00 = (ProStringList *)(long)local_2fc;
      qVar3 = QList<QString>::size(&Option::cpp_ext);
      if (qVar3 <= (long)this_00) break;
      pQVar4 = QList<QString>::operator[]
                         ((QList<QString> *)
                          CONCAT17(in_stack_fffffffffffffcb7,
                                   CONCAT16(in_stack_fffffffffffffcb6,
                                            CONCAT15(in_stack_fffffffffffffcb5,
                                                     CONCAT14(in_stack_fffffffffffffcb4,
                                                              in_stack_fffffffffffffcb0)))),
                          CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      uVar5 = QString::endsWith(in_RSI,(CaseSensitivity)pQVar4);
      if ((uVar5 & 1) != 0) {
        ProKey::ProKey((ProKey *)
                       CONCAT17(in_stack_fffffffffffffcb7,
                                CONCAT16(in_stack_fffffffffffffcb6,
                                         CONCAT15(in_stack_fffffffffffffcb5,
                                                  CONCAT14(in_stack_fffffffffffffcb4,
                                                           in_stack_fffffffffffffcb0)))),
                       (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        ProKey::operator=((ProKey *)
                          CONCAT17(in_stack_fffffffffffffcb7,
                                   CONCAT16(in_stack_fffffffffffffcb6,
                                            CONCAT15(in_stack_fffffffffffffcb5,
                                                     CONCAT14(in_stack_fffffffffffffcb4,
                                                              in_stack_fffffffffffffcb0)))),
                          (ProKey *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        ProKey::~ProKey((ProKey *)0x1e735a);
        break;
      }
      local_2fc = local_2fc + 1;
    }
    bVar1 = ProString::isEmpty(&local_a0);
    if (bVar1) {
      local_300 = 0;
      while( true ) {
        in_stack_fffffffffffffcc0 = (ProjectGenerator *)(long)local_300;
        qVar3 = QList<QString>::size(&Option::h_ext);
        if (qVar3 <= (long)in_stack_fffffffffffffcc0) break;
        pQVar6 = QList<QString>::at((QList<QString> *)
                                    CONCAT17(in_stack_fffffffffffffcb7,
                                             CONCAT16(in_stack_fffffffffffffcb6,
                                                      CONCAT15(in_stack_fffffffffffffcb5,
                                                               CONCAT14(in_stack_fffffffffffffcb4,
                                                                        in_stack_fffffffffffffcb0)))
                                            ),
                                    CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        uVar5 = QString::endsWith(in_RSI,(CaseSensitivity)pQVar6);
        if ((uVar5 & 1) != 0) {
          ProKey::ProKey((ProKey *)
                         CONCAT17(in_stack_fffffffffffffcb7,
                                  CONCAT16(in_stack_fffffffffffffcb6,
                                           CONCAT15(in_stack_fffffffffffffcb5,
                                                    CONCAT14(in_stack_fffffffffffffcb4,
                                                             in_stack_fffffffffffffcb0)))),
                         (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
          ProKey::operator=((ProKey *)
                            CONCAT17(in_stack_fffffffffffffcb7,
                                     CONCAT16(in_stack_fffffffffffffcb6,
                                              CONCAT15(in_stack_fffffffffffffcb5,
                                                       CONCAT14(in_stack_fffffffffffffcb4,
                                                                in_stack_fffffffffffffcb0)))),
                            (ProKey *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8))
          ;
          ProKey::~ProKey((ProKey *)0x1e740e);
          break;
        }
        local_300 = local_300 + 1;
      }
    }
    bVar1 = ProString::isEmpty(&local_a0);
    if (bVar1) {
      local_304 = 0;
      while( true ) {
        in_stack_fffffffffffffcb8 = (QString *)(long)local_304;
        qVar3 = QList<QString>::size(&Option::c_ext);
        if (qVar3 <= (long)in_stack_fffffffffffffcb8) break;
        pQVar4 = QList<QString>::operator[]
                           ((QList<QString> *)
                            CONCAT17(in_stack_fffffffffffffcb7,
                                     CONCAT16(in_stack_fffffffffffffcb6,
                                              CONCAT15(in_stack_fffffffffffffcb5,
                                                       CONCAT14(in_stack_fffffffffffffcb4,
                                                                in_stack_fffffffffffffcb0)))),
                            CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        uVar5 = QString::endsWith(in_RSI,(CaseSensitivity)pQVar4);
        if ((uVar5 & 1) != 0) {
          ProKey::ProKey((ProKey *)
                         CONCAT17(in_stack_fffffffffffffcb7,
                                  CONCAT16(in_stack_fffffffffffffcb6,
                                           CONCAT15(in_stack_fffffffffffffcb5,
                                                    CONCAT14(in_stack_fffffffffffffcb4,
                                                             in_stack_fffffffffffffcb0)))),
                         (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
          ProKey::operator=((ProKey *)
                            CONCAT17(in_stack_fffffffffffffcb7,
                                     CONCAT16(in_stack_fffffffffffffcb6,
                                              CONCAT15(in_stack_fffffffffffffcb5,
                                                       CONCAT14(in_stack_fffffffffffffcb4,
                                                                in_stack_fffffffffffffcb0)))),
                            (ProKey *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8))
          ;
          ProKey::~ProKey((ProKey *)0x1e74c4);
          break;
        }
        local_304 = local_304 + 1;
      }
    }
    bVar1 = ProString::isEmpty(&local_a0);
    if (bVar1) {
      uVar5 = QString::endsWith(in_RSI,0x3bdad0);
      if ((uVar5 & 1) == 0) {
        uVar5 = QString::endsWith(in_RSI,0x3bdb90);
        if ((uVar5 & 1) == 0) {
          uVar5 = QString::endsWith(in_RSI,0x3bdba8);
          if ((uVar5 & 1) == 0) {
            QString::QString(in_stack_fffffffffffffcb8,(char *)in_RSI);
            bVar2 = QString::endsWith(in_RSI,(CaseSensitivity)local_1d8);
            in_stack_fffffffffffffcb6 = 1;
            in_stack_fffffffffffffcb7 = in_stack_fffffffffffffcb6;
            if ((bVar2 & 1) == 0) {
              QString::QString(in_stack_fffffffffffffcb8,(char *)in_RSI);
              in_stack_fffffffffffffcb6 = QString::endsWith(in_RSI,(CaseSensitivity)local_1f0);
              in_stack_fffffffffffffcb7 = in_stack_fffffffffffffcb6;
              QString::~QString((QString *)0x1e7684);
            }
            QString::~QString((QString *)0x1e7691);
            if ((in_stack_fffffffffffffcb6 & 1) == 0) {
              QString::QString(in_stack_fffffffffffffcb8,(char *)in_RSI);
              in_stack_fffffffffffffcb5 = QString::endsWith(in_RSI,(CaseSensitivity)local_238);
              QString::~QString((QString *)0x1e770f);
              if ((in_stack_fffffffffffffcb5 & 1) != 0) {
                ProKey::ProKey((ProKey *)
                               CONCAT17(in_stack_fffffffffffffcb7,
                                        CONCAT16(in_stack_fffffffffffffcb6,
                                                 CONCAT15(in_stack_fffffffffffffcb5,
                                                          CONCAT14(in_stack_fffffffffffffcb4,
                                                                   in_stack_fffffffffffffcb0)))),
                               (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
                              );
                ProKey::operator=((ProKey *)
                                  CONCAT17(in_stack_fffffffffffffcb7,
                                           CONCAT16(in_stack_fffffffffffffcb6,
                                                    CONCAT15(in_stack_fffffffffffffcb5,
                                                             CONCAT14(in_stack_fffffffffffffcb4,
                                                                      in_stack_fffffffffffffcb0)))),
                                  (ProKey *)
                                  CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
                ProKey::~ProKey((ProKey *)0x1e774f);
              }
            }
            else {
              ProKey::ProKey((ProKey *)
                             CONCAT17(in_stack_fffffffffffffcb7,
                                      CONCAT16(in_stack_fffffffffffffcb6,
                                               CONCAT15(in_stack_fffffffffffffcb5,
                                                        CONCAT14(in_stack_fffffffffffffcb4,
                                                                 in_stack_fffffffffffffcb0)))),
                             (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
              ProKey::operator=((ProKey *)
                                CONCAT17(in_stack_fffffffffffffcb7,
                                         CONCAT16(in_stack_fffffffffffffcb6,
                                                  CONCAT15(in_stack_fffffffffffffcb5,
                                                           CONCAT14(in_stack_fffffffffffffcb4,
                                                                    in_stack_fffffffffffffcb0)))),
                                (ProKey *)
                                CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
              ProKey::~ProKey((ProKey *)0x1e76d1);
            }
          }
          else {
            ProKey::ProKey((ProKey *)
                           CONCAT17(in_stack_fffffffffffffcb7,
                                    CONCAT16(in_stack_fffffffffffffcb6,
                                             CONCAT15(in_stack_fffffffffffffcb5,
                                                      CONCAT14(in_stack_fffffffffffffcb4,
                                                               in_stack_fffffffffffffcb0)))),
                           (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
            ProKey::operator=((ProKey *)
                              CONCAT17(in_stack_fffffffffffffcb7,
                                       CONCAT16(in_stack_fffffffffffffcb6,
                                                CONCAT15(in_stack_fffffffffffffcb5,
                                                         CONCAT14(in_stack_fffffffffffffcb4,
                                                                  in_stack_fffffffffffffcb0)))),
                              (ProKey *)
                              CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
            ProKey::~ProKey((ProKey *)0x1e75f0);
          }
        }
        else {
          ProKey::ProKey((ProKey *)
                         CONCAT17(in_stack_fffffffffffffcb7,
                                  CONCAT16(in_stack_fffffffffffffcb6,
                                           CONCAT15(in_stack_fffffffffffffcb5,
                                                    CONCAT14(in_stack_fffffffffffffcb4,
                                                             in_stack_fffffffffffffcb0)))),
                         (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
          ProKey::operator=((ProKey *)
                            CONCAT17(in_stack_fffffffffffffcb7,
                                     CONCAT16(in_stack_fffffffffffffcb6,
                                              CONCAT15(in_stack_fffffffffffffcb5,
                                                       CONCAT14(in_stack_fffffffffffffcb4,
                                                                in_stack_fffffffffffffcb0)))),
                            (ProKey *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8))
          ;
          ProKey::~ProKey((ProKey *)0x1e7599);
        }
      }
      else {
        ProKey::ProKey((ProKey *)
                       CONCAT17(in_stack_fffffffffffffcb7,
                                CONCAT16(in_stack_fffffffffffffcb6,
                                         CONCAT15(in_stack_fffffffffffffcb5,
                                                  CONCAT14(in_stack_fffffffffffffcb4,
                                                           in_stack_fffffffffffffcb0)))),
                       (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        ProKey::operator=((ProKey *)
                          CONCAT17(in_stack_fffffffffffffcb7,
                                   CONCAT16(in_stack_fffffffffffffcb6,
                                            CONCAT15(in_stack_fffffffffffffcb5,
                                                     CONCAT14(in_stack_fffffffffffffcb4,
                                                              in_stack_fffffffffffffcb0)))),
                          (ProKey *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        ProKey::~ProKey((ProKey *)0x1e7542);
      }
    }
    QFlags<MakefileGenerator::FileFixifyType>::QFlags
              ((QFlags<MakefileGenerator::FileFixifyType> *)
               CONCAT17(in_stack_fffffffffffffcb7,
                        CONCAT16(in_stack_fffffffffffffcb6,
                                 CONCAT15(in_stack_fffffffffffffcb5,
                                          CONCAT14(in_stack_fffffffffffffcb4,
                                                   in_stack_fffffffffffffcb0)))),
               in_stack_fffffffffffffcac);
    MakefileGenerator::fileFixify
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               (FileFixifyTypes)in_stack_0000020c.i,(bool)in_stack_fffffffffffffd57);
    fixPathToQmake(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    cs = (CaseSensitivity)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
    QString::~QString((QString *)0x1e77e0);
    QMakeProject::values
              ((QMakeProject *)
               CONCAT17(in_stack_fffffffffffffcb7,
                        CONCAT16(in_stack_fffffffffffffcb6,
                                 CONCAT15(in_stack_fffffffffffffcb5,
                                          CONCAT14(in_stack_fffffffffffffcb4,
                                                   in_stack_fffffffffffffcb0)))),
               (ProKey *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    local_2d9 = ProStringList::contains(this_00,(QString *)in_stack_fffffffffffffcc0,cs);
    if (!local_2d9) {
      ProString::ProString
                ((ProString *)
                 CONCAT17(in_stack_fffffffffffffcb7,
                          CONCAT16(in_stack_fffffffffffffcb6,
                                   CONCAT15(in_stack_fffffffffffffcb5,
                                            CONCAT14(in_stack_fffffffffffffcb4,
                                                     in_stack_fffffffffffffcb0)))),
                 (QString *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      QList<ProString>::operator+=
                ((QList<ProString> *)
                 CONCAT17(in_stack_fffffffffffffcb7,
                          CONCAT16(in_stack_fffffffffffffcb6,
                                   CONCAT15(in_stack_fffffffffffffcb5,
                                            CONCAT14(in_stack_fffffffffffffcb4,
                                                     in_stack_fffffffffffffcb0)))),
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      ProString::~ProString((ProString *)0x1e7859);
    }
    local_2d9 = !local_2d9;
    QString::~QString((QString *)0x1e7882);
    ProKey::~ProKey((ProKey *)0x1e788f);
  }
  QString::~QString((QString *)0x1e789c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_2d9;
  }
  __stack_chk_fail();
}

Assistant:

bool
ProjectGenerator::addFile(QString file)
{
    file = fileFixify(file, FileFixifyToIndir);
    QString dir;
    int s = file.lastIndexOf(Option::dir_sep);
    if(s != -1)
        dir = file.left(s+1);
    if(file.mid(dir.size(), Option::h_moc_mod.size()) == Option::h_moc_mod)
        return false;

    ProKey where;
    for(int cppit = 0; cppit < Option::cpp_ext.size(); ++cppit) {
        if(file.endsWith(Option::cpp_ext[cppit])) {
            where = "SOURCES";
            break;
        }
    }
    if(where.isEmpty()) {
        for(int hit = 0; hit < Option::h_ext.size(); ++hit)
            if(file.endsWith(Option::h_ext.at(hit))) {
                where = "HEADERS";
                break;
            }
    }
    if(where.isEmpty()) {
        for(int cit = 0; cit < Option::c_ext.size(); ++cit) {
            if(file.endsWith(Option::c_ext[cit])) {
                where = "SOURCES";
                break;
            }
        }
    }
    if(where.isEmpty()) {
        if(file.endsWith(Option::ui_ext))
            where = "FORMS";
        else if(file.endsWith(Option::lex_ext))
            where = "LEXSOURCES";
        else if(file.endsWith(Option::yacc_ext))
            where = "YACCSOURCES";
        else if(file.endsWith(".ts") || file.endsWith(".xlf"))
            where = "TRANSLATIONS";
        else if(file.endsWith(".qrc"))
            where = "RESOURCES";
    }

    QString newfile = fixPathToQmake(fileFixify(file));

    ProStringList &endList = project->values(where);
    if(!endList.contains(newfile, Qt::CaseInsensitive)) {
        endList += newfile;
        return true;
    }
    return false;
}